

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxdraw.c
# Opt level: O0

wchar_t nh_box_mvwhline(WINDOW *win,wchar_t y,wchar_t x,wchar_t n,attr_t attrs)

{
  int iVar1;
  wchar_t local_58;
  wchar_t local_54;
  wchar_t local_4c;
  wchar_t r;
  wchar_t tmp [2];
  cchar_t ch;
  attr_t attrs_local;
  wchar_t n_local;
  wchar_t x_local;
  wchar_t y_local;
  WINDOW *win_local;
  
  if (box_draw_mode == L'\x01') {
    local_4c = box_chars[1][8];
    r = L'\0';
    setcchar(tmp,&local_4c,attrs,(ushort)(attrs >> 8) & 0xff,0);
    iVar1 = wmove(win,y,x);
    if (iVar1 == -1) {
      local_54 = L'\xffffffff';
    }
    else {
      local_54 = whline_set(win,tmp,n);
    }
    win_local._4_4_ = local_54;
  }
  else {
    wattr_on(win,attrs,0);
    iVar1 = wmove(win,y,x);
    if (iVar1 == -1) {
      local_58 = L'\xffffffff';
    }
    else {
      local_58 = whline(win,box_chars[box_draw_mode][8],n);
    }
    wattr_off(win,attrs,0);
    win_local._4_4_ = local_58;
  }
  return win_local._4_4_;
}

Assistant:

int nh_box_mvwhline(WINDOW *win, int y, int x, int n, attr_t attrs)
{
    if (box_draw_mode == 1) {
	cchar_t ch;
	NH_BOX_SETCCHAR(&ch, HLINE, attrs);
	return mvwhline_set(win, y, x, &ch, n);

    } else {
	int r;
	wattron(win, attrs);
	r = mvwhline(win, y, x, NH_BOX_CHAR(HLINE), n);
	wattroff(win, attrs);
	return r;
    }
}